

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O1

void PredictorSub13_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  undefined8 uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  ushort uVar8;
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  unkuint9 Var11;
  undefined1 auVar12 [11];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  short sVar21;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  undefined1 auVar22 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  short sVar37;
  undefined1 auVar38 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ushort uVar48;
  short sVar49;
  undefined1 auVar50 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 uVar30;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  
  auVar16 = _DAT_00151c90;
  auVar15 = _DAT_00150cf0;
  uVar20 = 0;
  if (1 < num_pixels) {
    uVar19 = 0;
    do {
      uVar20 = *(ulong *)(in + (uVar19 - 1));
      uVar30 = (undefined1)(uVar20 >> 0x38);
      auVar27._8_6_ = 0;
      auVar27._0_8_ = uVar20;
      auVar27[0xe] = uVar30;
      auVar27[0xf] = uVar30;
      uVar30 = (undefined1)(uVar20 >> 0x30);
      auVar26._14_2_ = auVar27._14_2_;
      auVar26._8_5_ = 0;
      auVar26._0_8_ = uVar20;
      auVar26[0xd] = uVar30;
      auVar25._13_3_ = auVar26._13_3_;
      auVar25._8_4_ = 0;
      auVar25._0_8_ = uVar20;
      auVar25[0xc] = uVar30;
      uVar30 = (undefined1)(uVar20 >> 0x28);
      auVar24._12_4_ = auVar25._12_4_;
      auVar24._8_3_ = 0;
      auVar24._0_8_ = uVar20;
      auVar24[0xb] = uVar30;
      auVar23._11_5_ = auVar24._11_5_;
      auVar23._8_2_ = 0;
      auVar23._0_8_ = uVar20;
      auVar23[10] = uVar30;
      uVar30 = (undefined1)(uVar20 >> 0x20);
      auVar22._10_6_ = auVar23._10_6_;
      auVar22[8] = 0;
      auVar22._0_8_ = uVar20;
      auVar22[9] = uVar30;
      auVar50._9_7_ = auVar22._9_7_;
      auVar50[8] = uVar30;
      auVar50._0_8_ = uVar20;
      uVar30 = (undefined1)(uVar20 >> 0x18);
      auVar29._8_8_ = auVar50._8_8_;
      auVar29[7] = uVar30;
      auVar29[6] = uVar30;
      uVar30 = (undefined1)(uVar20 >> 0x10);
      auVar29[5] = uVar30;
      auVar29[4] = uVar30;
      uVar30 = (undefined1)(uVar20 >> 8);
      auVar29[3] = uVar30;
      auVar29[2] = uVar30;
      auVar29[0] = (undefined1)uVar20;
      auVar29[1] = auVar29[0];
      uVar1 = *(undefined8 *)(in + uVar19);
      uVar20 = *(ulong *)(upper + uVar19);
      uVar30 = (undefined1)(uVar20 >> 0x38);
      auVar44._8_6_ = 0;
      auVar44._0_8_ = uVar20;
      auVar44[0xe] = uVar30;
      auVar44[0xf] = uVar30;
      uVar30 = (undefined1)(uVar20 >> 0x30);
      auVar43._14_2_ = auVar44._14_2_;
      auVar43._8_5_ = 0;
      auVar43._0_8_ = uVar20;
      auVar43[0xd] = uVar30;
      auVar42._13_3_ = auVar43._13_3_;
      auVar42._8_4_ = 0;
      auVar42._0_8_ = uVar20;
      auVar42[0xc] = uVar30;
      uVar30 = (undefined1)(uVar20 >> 0x28);
      auVar41._12_4_ = auVar42._12_4_;
      auVar41._8_3_ = 0;
      auVar41._0_8_ = uVar20;
      auVar41[0xb] = uVar30;
      auVar40._11_5_ = auVar41._11_5_;
      auVar40._8_2_ = 0;
      auVar40._0_8_ = uVar20;
      auVar40[10] = uVar30;
      uVar30 = (undefined1)(uVar20 >> 0x20);
      auVar39._10_6_ = auVar40._10_6_;
      auVar39[8] = 0;
      auVar39._0_8_ = uVar20;
      auVar39[9] = uVar30;
      auVar38._9_7_ = auVar39._9_7_;
      auVar38[8] = uVar30;
      auVar38._0_8_ = uVar20;
      uVar30 = (undefined1)(uVar20 >> 0x18);
      auVar45._8_8_ = auVar38._8_8_;
      auVar45[7] = uVar30;
      auVar45[6] = uVar30;
      uVar30 = (undefined1)(uVar20 >> 0x10);
      auVar45[5] = uVar30;
      auVar45[4] = uVar30;
      uVar30 = (undefined1)(uVar20 >> 8);
      auVar45[3] = uVar30;
      auVar45[2] = uVar30;
      auVar45[0] = (undefined1)uVar20;
      auVar45[1] = auVar45[0];
      uVar20 = *(ulong *)(upper + (uVar19 - 1));
      auVar2._8_6_ = 0;
      auVar2._0_8_ = uVar20;
      auVar2[0xe] = (char)(uVar20 >> 0x38);
      auVar3._8_4_ = 0;
      auVar3._0_8_ = uVar20;
      auVar3[0xc] = (char)(uVar20 >> 0x30);
      auVar3._13_2_ = auVar2._13_2_;
      auVar4._8_4_ = 0;
      auVar4._0_8_ = uVar20;
      auVar4._12_3_ = auVar3._12_3_;
      auVar5._8_2_ = 0;
      auVar5._0_8_ = uVar20;
      auVar5[10] = (char)(uVar20 >> 0x28);
      auVar5._11_4_ = auVar4._11_4_;
      auVar6._8_2_ = 0;
      auVar6._0_8_ = uVar20;
      auVar6._10_5_ = auVar5._10_5_;
      auVar7[8] = (char)(uVar20 >> 0x20);
      auVar7._0_8_ = uVar20;
      auVar7._9_6_ = auVar6._9_6_;
      auVar10._7_8_ = 0;
      auVar10._0_7_ = auVar7._8_7_;
      Var11 = CONCAT81(SUB158(auVar10 << 0x40,7),(char)(uVar20 >> 0x18));
      auVar13._9_6_ = 0;
      auVar13._0_9_ = Var11;
      auVar12._1_10_ = SUB1510(auVar13 << 0x30,5);
      auVar12[0] = (char)(uVar20 >> 0x10);
      auVar14._11_4_ = 0;
      auVar14._0_11_ = auVar12;
      auVar9[2] = (char)(uVar20 >> 8);
      auVar9._0_2_ = (ushort)uVar20;
      auVar9._3_12_ = SUB1512(auVar14 << 0x20,3);
      uVar48 = (ushort)uVar20 & 0xff;
      auVar50 = auVar45 & auVar29;
      auVar45 = auVar45 ^ auVar29;
      auVar46._0_2_ = auVar45._0_2_ >> 1;
      auVar46._2_2_ = auVar45._2_2_ >> 1;
      auVar46._4_2_ = auVar45._4_2_ >> 1;
      auVar46._6_2_ = auVar45._6_2_ >> 1;
      auVar46._8_2_ = auVar45._8_2_ >> 1;
      auVar46._10_2_ = auVar45._10_2_ >> 1;
      auVar46._12_2_ = auVar45._12_2_ >> 1;
      auVar46._14_2_ = auVar45._14_2_ >> 1;
      auVar46 = auVar46 & auVar16;
      auVar47[0] = auVar46[0] + auVar50[0];
      auVar47[1] = auVar46[1] + auVar50[1];
      auVar47[2] = auVar46[2] + auVar50[2];
      auVar47[3] = auVar46[3] + auVar50[3];
      auVar47[4] = auVar46[4] + auVar50[4];
      auVar47[5] = auVar46[5] + auVar50[5];
      auVar47[6] = auVar46[6] + auVar50[6];
      auVar47[7] = auVar46[7] + auVar50[7];
      auVar47[8] = auVar46[8] + auVar50[8];
      auVar47[9] = auVar46[9] + auVar50[9];
      auVar47[10] = auVar46[10] + auVar50[10];
      auVar47[0xb] = auVar46[0xb] + auVar50[0xb];
      auVar47[0xc] = auVar46[0xc] + auVar50[0xc];
      auVar47[0xd] = auVar46[0xd] + auVar50[0xd];
      auVar47[0xe] = auVar46[0xe] + auVar50[0xe];
      auVar47[0xf] = auVar46[0xf] + auVar50[0xf];
      auVar47 = auVar47 & auVar15;
      sVar21 = auVar47._0_2_;
      sVar31 = auVar47._2_2_;
      sVar32 = auVar47._4_2_;
      sVar33 = auVar47._6_2_;
      sVar49 = (short)Var11;
      sVar34 = auVar47._8_2_;
      sVar35 = auVar47._10_2_;
      sVar36 = auVar47._12_2_;
      sVar37 = auVar47._14_2_;
      uVar8 = auVar2._13_2_ >> 8;
      auVar28._0_2_ = (sVar21 - uVar48) + (ushort)(sVar21 < (short)uVar48);
      auVar28._2_2_ = (sVar31 - auVar9._2_2_) + (ushort)(sVar31 < auVar9._2_2_);
      auVar28._4_2_ = (sVar32 - auVar12._0_2_) + (ushort)(sVar32 < auVar12._0_2_);
      auVar28._6_2_ = (sVar33 - sVar49) + (ushort)(sVar33 < sVar49);
      auVar28._8_2_ = (sVar34 - auVar7._8_2_) + (ushort)(sVar34 < auVar7._8_2_);
      auVar28._10_2_ = (sVar35 - auVar5._10_2_) + (ushort)(sVar35 < auVar5._10_2_);
      auVar28._12_2_ = (sVar36 - auVar3._12_2_) + (ushort)(sVar36 < auVar3._12_2_);
      auVar28._14_2_ = (sVar37 - uVar8) + (ushort)(sVar37 < (short)uVar8);
      auVar29 = psraw(auVar28,1);
      sVar21 = auVar29._0_2_ + sVar21;
      sVar31 = auVar29._2_2_ + sVar31;
      sVar32 = auVar29._4_2_ + sVar32;
      sVar33 = auVar29._6_2_ + sVar33;
      sVar34 = auVar29._8_2_ + sVar34;
      sVar35 = auVar29._10_2_ + sVar35;
      sVar36 = auVar29._12_2_ + sVar36;
      sVar37 = auVar29._14_2_ + sVar37;
      *(ulong *)(out + uVar19) =
           CONCAT17((char)((ulong)uVar1 >> 0x38) -
                    ((0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37)),
                    CONCAT16((char)((ulong)uVar1 >> 0x30) -
                             ((0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36)),
                             CONCAT15((char)((ulong)uVar1 >> 0x28) -
                                      ((0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 -
                                      (0xff < sVar35)),
                                      CONCAT14((char)((ulong)uVar1 >> 0x20) -
                                               ((0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 -
                                               (0xff < sVar34)),
                                               CONCAT13((char)((ulong)uVar1 >> 0x18) -
                                                        ((0 < sVar33) * (sVar33 < 0x100) *
                                                         (char)sVar33 - (0xff < sVar33)),
                                                        CONCAT12((char)((ulong)uVar1 >> 0x10) -
                                                                 ((0 < sVar32) * (sVar32 < 0x100) *
                                                                  (char)sVar32 - (0xff < sVar32)),
                                                                 CONCAT11((char)((ulong)uVar1 >> 8)
                                                                          - ((0 < sVar31) *
                                                                             (sVar31 < 0x100) *
                                                                             (char)sVar31 -
                                                                            (0xff < sVar31)),
                                                                          (char)uVar1 -
                                                                          ((0 < sVar21) *
                                                                           (sVar21 < 0x100) *
                                                                           (char)sVar21 -
                                                                          (0xff < sVar21)))))))));
      uVar20 = uVar19 + 2;
      uVar18 = uVar19 + 4;
      uVar19 = uVar20;
    } while (uVar18 <= (uint)num_pixels);
  }
  iVar17 = num_pixels - (int)uVar20;
  if (iVar17 == 0) {
    return;
  }
  uVar20 = uVar20 & 0xffffffff;
  (*VP8LPredictorsSub_C[0xd])(in + uVar20,upper + uVar20,iVar17,out + uVar20);
  return;
}

Assistant:

static void PredictorSub13_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* out) {
  int i;
  const __m128i zero = _mm_setzero_si128();
  for (i = 0; i + 2 <= num_pixels; i += 2) {
    // we can only process two pixels at a time
    const __m128i L = _mm_loadl_epi64((const __m128i*)&in[i - 1]);
    const __m128i src = _mm_loadl_epi64((const __m128i*)&in[i]);
    const __m128i T = _mm_loadl_epi64((const __m128i*)&upper[i]);
    const __m128i TL = _mm_loadl_epi64((const __m128i*)&upper[i - 1]);
    const __m128i L_lo = _mm_unpacklo_epi8(L, zero);
    const __m128i T_lo = _mm_unpacklo_epi8(T, zero);
    const __m128i TL_lo = _mm_unpacklo_epi8(TL, zero);
    const __m128i sum = _mm_add_epi16(T_lo, L_lo);
    const __m128i avg = _mm_srli_epi16(sum, 1);
    const __m128i A1 = _mm_sub_epi16(avg, TL_lo);
    const __m128i bit_fix = _mm_cmpgt_epi16(TL_lo, avg);
    const __m128i A2 = _mm_sub_epi16(A1, bit_fix);
    const __m128i A3 = _mm_srai_epi16(A2, 1);
    const __m128i A4 = _mm_add_epi16(avg, A3);
    const __m128i pred = _mm_packus_epi16(A4, A4);
    const __m128i res = _mm_sub_epi8(src, pred);
    _mm_storel_epi64((__m128i*)&out[i], res);
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[13](in + i, upper + i, num_pixels - i, out + i);
  }
}